

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_TokenWithNone_Test::TestBody
          (InterpreterTestSuite_PC_TokenWithNone_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer *ppuVar2;
  initializer_list<unsigned_char> __l;
  bool bVar3;
  element_type *peVar4;
  MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_00;
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_01;
  MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pMVar5;
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pTVar6;
  element_type *this_02;
  char *pcVar7;
  MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_03;
  TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_04;
  CommissionerAppMock *pCVar8;
  char *in_R9;
  string local_628;
  AssertHelper local_608;
  Message local_600;
  bool local_5f1;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar__1;
  allocator local_591;
  string local_590;
  Expression local_570;
  AssertHelper local_558;
  Message local_550;
  ErrorCode local_548;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  Error local_4f8;
  ErrorCode local_4cc;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_1;
  Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> local_4b0;
  WithoutMatchers local_489;
  MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> local_488;
  Error local_478;
  ReturnAction<ot::commissioner::Error> local_450;
  undefined1 local_440 [40];
  Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> local_418;
  MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_400;
  string local_3e0;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_;
  allocator local_349;
  string local_348;
  Expression local_328;
  AssertHelper local_310;
  Message local_308;
  Status local_2fa;
  Status local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar;
  Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> local_2e0;
  WithoutMatchers local_2b9;
  MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> local_2b8;
  Error local_2a8;
  ReturnAction<ot::commissioner::Error> local_280;
  undefined1 local_270 [40];
  Matcher<unsigned_short> local_248;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_230;
  MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_218;
  allocator<unsigned_char> local_1df;
  uchar local_1de [6];
  iterator local_1d8;
  Timestamp local_1d0;
  undefined1 local_1c8 [8];
  ByteArray token;
  Value value;
  Expression expr;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_TokenWithNone_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value
            ((Value *)&token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  builtin_memcpy(local_1de,"123aef",6);
  local_1d8 = local_1de;
  local_1d0 = (Timestamp)0x6;
  std::allocator<unsigned_char>::allocator(&local_1df);
  __l._M_len = (size_type)local_1d0;
  __l._M_array = local_1d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,__l,&local_1df);
  std::allocator<unsigned_char>::~allocator(&local_1df);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_230,(AnythingMatcher *)&testing::_);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_248,(AnythingMatcher *)&testing::_);
  CommissionerAppMock::gmock_RequestToken(&local_218,peVar4,&local_230,&local_248);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
            ::operator()(&local_218,(WithoutMatchers *)(local_270 + 0x27),(void *)0x0);
  this_01 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x53f,"*ctx.mDefaultCommissionerObject","RequestToken(_, _)");
  ot::commissioner::Error::Error(&local_2a8);
  testing::Return<ot::commissioner::Error>((testing *)&local_280,&local_2a8);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              *)local_270,(ReturnAction *)&local_280);
  pCVar8 = (CommissionerAppMock *)local_270;
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  ::WillOnce(this_01,(Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                      *)pCVar8);
  testing::
  Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  ::~Action((Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
             *)local_270);
  testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_280);
  ot::commissioner::Error::~Error(&local_2a8);
  testing::internal::
  MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  ::~MockSpec(&local_218);
  testing::Matcher<unsigned_short>::~Matcher(&local_248);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_230);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  local_2b8.function_mocker_ =
       (FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
       CommissionerAppMock::gmock_GetToken
                 ((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                  peVar4,pCVar8);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           operator()(&local_2b8,&local_2b9,(void *)0x0);
  pTVar6 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt(pMVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x540,"*ctx.mDefaultCommissionerObject","GetToken()");
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )testing::ReturnRef<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            (&local_2e0,(ReturnRefAction *)&gtest_ar.message_);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar6,&local_2e0);
  testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::~Action
            (&local_2e0);
  this_02 = std::
            __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ctx.mInterpreter.mJobManager.
                             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
  local_2f9 = ot::commissioner::persistent_storage::Registry::ForgetCurrentNetwork(this_02);
  local_2fa = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
            ((EqHelper *)local_2f8,"ctx.mInterpreter.mRegistry->ForgetCurrentNetwork()",
             "RegistryStatus::kSuccess",&local_2f9,&local_2fa);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar3) {
    testing::Message::Message(&local_308);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x542,pcVar7);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"token request 127.0.0.1 2001",&local_349);
  ot::commissioner::Interpreter::ParseExpression(&local_328,(Interpreter *)local_140,&local_348);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,pvVar1);
  ppuVar2 = &token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ot::commissioner::Interpreter::Value::operator=((Value *)ppuVar2,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  local_3a9 = ot::commissioner::Interpreter::Value::HasNoError((Value *)ppuVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar3) {
    testing::Message::Message(&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3e0,(internal *)local_3a8,(AssertionResult *)0x46a487,"false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x545,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_418,(AnythingMatcher *)&testing::_);
  CommissionerAppMock::gmock_SetToken(&local_400,peVar4,&local_418);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::operator()(&local_400,(WithoutMatchers *)(local_440 + 0x27),(void *)0x0);
  this_04 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::InternalExpectedAt
                      (this_03,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x547,"*ctx.mDefaultCommissionerObject","SetToken(_)");
  ot::commissioner::Error::Error(&local_478);
  testing::Return<ot::commissioner::Error>((testing *)&local_450,&local_478);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
              *)local_440,(ReturnAction *)&local_450);
  pCVar8 = (CommissionerAppMock *)local_440;
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::WillOnce(this_04,(Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                      *)pCVar8);
  testing::
  Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::~Action((Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
             *)local_440);
  testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_450);
  ot::commissioner::Error::~Error(&local_478);
  testing::internal::
  MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::~MockSpec(&local_400);
  testing::Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>::~Matcher
            (&local_418);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  local_488.function_mocker_ =
       (FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
       CommissionerAppMock::gmock_GetToken
                 ((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                  peVar4,pCVar8);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           operator()(&local_488,&local_489,(void *)0x0);
  pTVar6 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt(pMVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x54a,"*ctx.mDefaultCommissionerObject","GetToken()");
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )testing::ReturnRef<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            (&local_4b0,(ReturnRefAction *)&gtest_ar_1.message_);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar6,&local_4b0);
  testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::~Action
            (&local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_518,"123aef",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"./tmp/token",&local_541);
  ot::commissioner::WriteFile(&local_4f8,&local_518,&local_540);
  local_4cc = ot::commissioner::Error::GetCode(&local_4f8);
  local_548 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_4c8,"WriteFile(\"123aef\", \"./tmp/token\").GetCode()",
             "ErrorCode::kNone",&local_4cc,&local_548);
  ot::commissioner::Error::~Error(&local_4f8);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar3) {
    testing::Message::Message(&local_550);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x54c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_590,"token set ./tmp/token",&local_591);
  ot::commissioner::Interpreter::ParseExpression(&local_570,(Interpreter *)local_140,&local_590);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_570);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__1.message_,(Interpreter *)local_140,pvVar1);
  ppuVar2 = &token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ot::commissioner::Interpreter::Value::operator=((Value *)ppuVar2,(Value *)&gtest_ar__1.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__1.message_);
  local_5f1 = ot::commissioner::Interpreter::Value::HasNoError((Value *)ppuVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f0,&local_5f1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar3) {
    testing::Message::Message(&local_600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_628,(internal *)local_5f0,(AssertionResult *)0x46a487,"false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x54f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  ot::commissioner::Interpreter::Value::~Value
            ((Value *)&token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_TokenWithNone)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    const ByteArray token = {'1', '2', '3', 'a', 'e', 'f'};

    // with no network selected we expect 'token request' to call
    // RequestToken() first, and then have GetToken() called on
    // default commissioner to update default config
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, RequestToken(_, _)).WillOnce(Return(Error{}));
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));

    EXPECT_EQ(ctx.mInterpreter.mRegistry->ForgetCurrentNetwork(), RegistryStatus::kSuccess);
    expr  = ctx.mInterpreter.ParseExpression("token request 127.0.0.1 2001");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, SetToken(_)).WillOnce(Return(Error{}));
    // 'token set' is also to update default config here, so we expect
    // GetToken() to be called on default commissioner instance
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));

    EXPECT_EQ(WriteFile("123aef", "./tmp/token").GetCode(), ErrorCode::kNone);
    expr  = ctx.mInterpreter.ParseExpression("token set ./tmp/token");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}